

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TicketSystem.cpp
# Opt level: O2

int main(void)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  UserManager *this;
  TrainManager *this_00;
  OrderManager *this_01;
  ostream *poVar4;
  undefined1 *puVar5;
  ulong uVar6;
  ulong uVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_02;
  size_type sVar8;
  int argc;
  string tmp;
  string ord;
  string local_cd8 [16];
  undefined8 auStack_cc8 [2];
  string argv [100];
  
  lVar3 = 0x10;
  do {
    puVar5 = (undefined1 *)((long)&argv[0]._M_dataplus._M_p + lVar3);
    *(undefined1 **)((long)auStack_cc8 + lVar3) = puVar5;
    *(undefined8 *)((long)auStack_cc8 + lVar3 + 8) = 0;
    *puVar5 = 0;
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0xc90);
  this = (UserManager *)operator_new(0x20);
  sjtu::UserManager::UserManager(this);
  this_00 = (TrainManager *)operator_new(0x28);
  sjtu::TrainManager::TrainManager(this_00);
  this_01 = (OrderManager *)operator_new(0x18);
  sjtu::OrderManager::OrderManager(this_01);
  do {
    tmp._M_dataplus._M_p = (pointer)&tmp.field_2;
    tmp._M_string_length = 0;
    tmp.field_2._M_local_buf[0] = '\0';
    ord._M_dataplus._M_p = (pointer)&ord.field_2;
    ord._M_string_length = 0;
    ord.field_2._M_local_buf[0] = '\0';
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&std::cin,(string *)&tmp);
    while ((tmp._M_dataplus._M_p[tmp._M_string_length - 1] == '\n' ||
           (tmp._M_dataplus._M_p[tmp._M_string_length - 1] == '\r'))) {
      std::__cxx11::string::pop_back();
    }
    argc = 0;
    iVar2 = 0;
    while (uVar7 = (ulong)iVar2, uVar6 = uVar7, uVar7 < tmp._M_string_length) {
      for (; (sVar8 = tmp._M_string_length, tmp._M_string_length != uVar6 &&
             (sVar8 = uVar6, tmp._M_dataplus._M_p[uVar6] != ' ')); uVar6 = uVar6 + 1) {
      }
      if (iVar2 == 0) {
        std::__cxx11::string::string(local_cd8,(string *)&tmp,uVar7,sVar8);
        this_02 = &ord;
      }
      else {
        std::__cxx11::string::string(local_cd8,(string *)&tmp,uVar7,(long)((int)sVar8 - iVar2));
        lVar3 = (long)argc;
        argc = argc + 1;
        this_02 = argv + lVar3;
      }
      std::__cxx11::string::operator=((string *)this_02,local_cd8);
      std::__cxx11::string::~string(local_cd8);
      iVar2 = (int)sVar8 + 1;
    }
    bVar1 = std::operator==(&ord,"add_user");
    if (bVar1) {
      sjtu::UserManager::add_user(this,argc,argv);
    }
    else {
      bVar1 = std::operator==(&ord,"login");
      if (bVar1) {
        sjtu::UserManager::login(this,argc,argv);
      }
      else {
        bVar1 = std::operator==(&ord,"logout");
        if (bVar1) {
          sjtu::UserManager::logout(this,argc,argv);
        }
        else {
          bVar1 = std::operator==(&ord,"query_profile");
          if (bVar1) {
            sjtu::UserManager::query_profile(this,argc,argv);
          }
          else {
            bVar1 = std::operator==(&ord,"modify_profile");
            if (bVar1) {
              sjtu::UserManager::modify_profile(this,argc,argv);
            }
            else {
              bVar1 = std::operator==(&ord,"add_train");
              if (bVar1) {
                sjtu::TrainManager::add_train(this_00,argc,argv);
              }
              else {
                bVar1 = std::operator==(&ord,"release_train");
                if (bVar1) {
                  sjtu::TrainManager::release_train(this_00,argc,argv);
                }
                else {
                  bVar1 = std::operator==(&ord,"query_train");
                  if (bVar1) {
                    sjtu::TrainManager::query_train(this_00,argc,argv);
                  }
                  else {
                    bVar1 = std::operator==(&ord,"delete_train");
                    if (bVar1) {
                      sjtu::TrainManager::delete_train(this_00,argc,argv);
                    }
                    else {
                      bVar1 = std::operator==(&ord,"query_ticket");
                      if (bVar1) {
                        sjtu::TrainManager::query_ticket(this_00,argc,argv);
                      }
                      else {
                        bVar1 = std::operator==(&ord,"query_transfer");
                        if (bVar1) {
                          sjtu::TrainManager::query_transfer(this_00,argc,argv);
                        }
                        else {
                          bVar1 = std::operator==(&ord,"buy_ticket");
                          if (bVar1) {
                            sjtu::OrderManager::buy_ticket(this_01,this,this_00,argc,argv);
                          }
                          else {
                            bVar1 = std::operator==(&ord,"query_order");
                            if (bVar1) {
                              sjtu::UserManager::query_order(this,this_01,argc,argv);
                            }
                            else {
                              bVar1 = std::operator==(&ord,"refund_ticket");
                              if (bVar1) {
                                sjtu::OrderManager::refund_ticket(this_01,this,this_00,argc,argv);
                              }
                              else {
                                bVar1 = std::operator==(&ord,"clean");
                                if (bVar1) {
                                  sjtu::UserManager::init(this,(EVP_PKEY_CTX *)0x1);
                                  sjtu::TrainManager::init(this_00,(EVP_PKEY_CTX *)0x1);
                                  sjtu::OrderManager::init(this_01,(EVP_PKEY_CTX *)0x1);
                                  poVar4 = (ostream *)
                                           std::ostream::operator<<((ostream *)&std::cout,0);
                                  std::endl<char,std::char_traits<char>>(poVar4);
                                }
                                else {
                                  bVar1 = std::operator==(&ord,"exit");
                                  if (bVar1) {
                                    sjtu::UserManager::~UserManager(this);
                                    operator_delete(this,0x20);
                                    sjtu::TrainManager::~TrainManager(this_00);
                                    operator_delete(this_00,0x28);
                                    sjtu::OrderManager::~OrderManager(this_01);
                                    operator_delete(this_01,0x18);
                                    poVar4 = std::operator<<((ostream *)&std::cout,"bye");
                                    std::endl<char,std::char_traits<char>>(poVar4);
                                    std::__cxx11::string::~string((string *)&ord);
                                    std::__cxx11::string::~string((string *)&tmp);
                                    lVar3 = 0xc60;
                                    do {
                                      std::__cxx11::string::~string
                                                ((string *)((long)&argv[0]._M_dataplus._M_p + lVar3)
                                                );
                                      lVar3 = lVar3 + -0x20;
                                    } while (lVar3 != -0x20);
                                    return 0;
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)&ord);
    std::__cxx11::string::~string((string *)&tmp);
  } while( true );
}

Assistant:

int main()
{
	/*std::ifstream in("data/3.in");
	std::cin.rdbuf(in.rdbuf());
	std::ofstream out("3.out");
	std::cout.rdbuf(out.rdbuf());*/
    std::string argv[100];
    int argc = 0, l, r;
    sjtu::UserManager *user_manager;
    sjtu::TrainManager *train_manager;
    sjtu::OrderManager *order_manager;
    user_manager = new sjtu::UserManager;
    train_manager = new sjtu::TrainManager;
    order_manager = new sjtu::OrderManager;
    while(1) {
        std::string tmp, ord;
        for (getline(std::cin, tmp);tmp.back() == '\r' || tmp.back() == '\n';tmp.pop_back());
        argc = 0;
        for (l = 0; l < tmp.length(); l = r + 1) {
            for (r = l; r < tmp.length() && tmp[r] != ' '; ++r);
            if (l != 0) argv[argc++] = std::string(tmp, l, r - l);
            else ord = std::string(tmp, l, r - l);
        }
        if(ord == "add_user") user_manager->add_user(argc, argv);
        else if (ord == "login") user_manager->login(argc, argv);
        else if (ord == "logout") user_manager->logout(argc, argv);
        else if (ord == "query_profile") user_manager->query_profile(argc, argv);
        else if (ord == "modify_profile") user_manager->modify_profile(argc, argv);
        else if (ord == "add_train") train_manager->add_train(argc, argv);
        else if (ord == "release_train") train_manager->release_train(argc, argv);
        else if (ord == "query_train") train_manager->query_train(argc, argv);
        else if (ord == "delete_train") train_manager->delete_train(argc, argv);
        else if (ord == "query_ticket") train_manager->query_ticket(argc, argv);
        else if (ord == "query_transfer") train_manager->query_transfer(argc, argv);
        else if (ord == "buy_ticket") order_manager->buy_ticket(user_manager, train_manager, argc, argv);
        else if (ord == "query_order") user_manager->query_order(order_manager, argc, argv);
        else if (ord == "refund_ticket") order_manager->refund_ticket(user_manager, train_manager, argc, argv);
        else if (ord == "clean") {
            user_manager->init(true);
            train_manager->init(true);
            order_manager->init(true);
            std::cout << 0 << std::endl;
        }
        else if (ord == "exit") {
            delete user_manager;
            delete train_manager;
            delete order_manager;
            std::cout << "bye" << std::endl;
            break;
        }
    }
    return 0;
}